

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

size_t Base64ToByteStream(char *InBuffer,size_t InCount,uint8_t *OutBuffer,size_t len)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  
  if (isFirstTime == '\0') {
    isFirstTime = '\x01';
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
      iT64[lVar6] = -1;
    }
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      iT64["ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"[lVar6]] = (char)lVar6;
    }
    iT64[0x3d] = '\0';
  }
  if ((InCount & 3) != 0 || InCount == 0) {
    return 0;
  }
  pcVar7 = InBuffer + InCount;
  uVar4 = ((long)((InCount >> 2) * 0x300000000) >> 0x20) + 1;
  do {
    pcVar7 = pcVar7 + -1;
    uVar4 = uVar4 - 1;
  } while (*pcVar7 == '=');
  if (len < uVar4) {
    uVar4 = 0xffffffffffffffff;
  }
  else {
    pbVar1 = OutBuffer + uVar4;
    lVar6 = 0;
    iVar5 = (int)(InCount >> 2);
    iVar8 = 0;
    if (0 < iVar5) {
      iVar8 = iVar5;
    }
    for (; iVar8 != (int)lVar6; lVar6 = lVar6 + 1) {
      bVar2 = iT64[(byte)InBuffer[lVar6 * 4 + 1]];
      *OutBuffer = bVar2 >> 4 | iT64[(byte)InBuffer[lVar6 * 4]] << 2;
      if (pbVar1 <= OutBuffer + 1) {
        return uVar4;
      }
      bVar3 = iT64[(byte)InBuffer[lVar6 * 4 + 2]];
      OutBuffer[1] = bVar3 >> 2 | bVar2 << 4;
      if (pbVar1 <= OutBuffer + 2) {
        return uVar4;
      }
      OutBuffer[2] = bVar3 << 6 | iT64[(byte)InBuffer[lVar6 * 4 + 3]];
      OutBuffer = OutBuffer + 3;
    }
  }
  return uVar4;
}

Assistant:

size_t                              /* Number of output bytes */
	Base64ToByteStream (
		      const char * InBuffer,           /* BASE64 encoded buffer */
		      size_t    InCount,          /* Number of input bytes */
		      uint8_t  * OutBuffer,	/* output buffer length */
		  size_t len         	/* length of output buffer */
	)
	{
		unsigned char * ps;
		unsigned char * pd;
		unsigned char   acc_1;
		unsigned char   acc_2;
		int             i;
		int             n;
		int             m;
		size_t outCount;

		if (isFirstTime) iT64Build();
		n = InCount/4;
		m = InCount%4;
		if (InCount && !m)
		     outCount = 3*n;
		else {
		     outCount = 0;
		     return 0;
		}

		ps = (unsigned char *)(InBuffer + InCount - 1);
		while ( *ps-- == P64 ) outCount--;
		ps = (unsigned char *)InBuffer;

		if (outCount > len) return -1;
		pd = OutBuffer;
		uint8_t * endOfOutBuffer = OutBuffer + outCount;
		for ( i = 0; i < n; i++ ){
		     acc_1 = iT64[*ps++];
		     acc_2 = iT64[*ps++];
		     acc_1 <<= 2;
		     acc_1 |= acc_2>>4;
		     *pd++  = acc_1;
			 if (pd >= endOfOutBuffer) break;

		     acc_2 <<= 4;
		     acc_1 = iT64[*ps++];
		     acc_2 |= acc_1 >> 2;
		     *pd++ = acc_2;
			  if (pd >= endOfOutBuffer) break;

		     acc_2 = iT64[*ps++];
		     acc_2 |= acc_1 << 6;
		     *pd++ = acc_2;
		}

		return outCount;
	}